

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::Version::RecordReadSample(Version *this,Slice internal_key)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t n;
  bool bVar5;
  Slice user_key;
  State state;
  FileMetaData *local_28;
  int local_20;
  int local_18;
  
  uVar2 = internal_key.size_;
  pcVar4 = internal_key.data_;
  if (uVar2 < 8) {
    pcVar4 = "";
    sVar3 = 0;
    bVar5 = false;
  }
  else {
    sVar3 = uVar2 - 8;
    bVar5 = (pcVar4[uVar2 - 8] & 0xfeU) == 0;
  }
  if (bVar5) {
    local_18 = 0;
    user_key.size_ = sVar3;
    user_key.data_ = pcVar4;
    ForEachOverlapping(this,user_key,internal_key,&local_28,
                       RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
                       FileMetaData__);
    if ((((1 < local_18) && (local_28 != (FileMetaData *)0x0)) &&
        (iVar1 = local_28->allowed_seeks, local_28->allowed_seeks = iVar1 + -1, iVar1 < 2)) &&
       (this->file_to_compact_ == (FileMetaData *)0x0)) {
      this->file_to_compact_ = local_28;
      this->file_to_compact_level_ = local_20;
      return true;
    }
  }
  return false;
}

Assistant:

bool Version::RecordReadSample(Slice internal_key) {
  ParsedInternalKey ikey;
  if (!ParseInternalKey(internal_key, &ikey)) {
    return false;
  }

  struct State {
    GetStats stats;  // Holds first matching file
    int matches;

    static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);
      state->matches++;
      if (state->matches == 1) {
        // Remember first match.
        state->stats.seek_file = f;
        state->stats.seek_file_level = level;
      }
      // We can stop iterating once we have a second match.
      return state->matches < 2;
    }
  };

  State state;
  state.matches = 0;
  ForEachOverlapping(ikey.user_key, internal_key, &state, &State::Match);

  // Must have at least two matches since we want to merge across
  // files. But what if we have a single file that contains many
  // overwrites and deletions?  Should we have another mechanism for
  // finding such files?
  if (state.matches >= 2) {
    // 1MB cost is about 1 seek (see comment in Builder::Apply).
    return UpdateStats(state.stats);
  }
  return false;
}